

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.cc
# Opt level: O1

void ACTION_SCORE::print_action_score
               (int f,v_array<ACTION_SCORE::action_score> *a_s,v_array<char> *param_3)

{
  ostream *poVar1;
  int *piVar2;
  char *__s;
  size_t sVar3;
  ulong uVar4;
  stringstream ss;
  char local_1d0;
  undefined7 uStack_1cf;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    if (a_s->_end != a_s->_begin) {
      uVar4 = 0;
      do {
        if (uVar4 != 0) {
          local_1d0 = ',';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1d0,1);
        }
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        local_1d0 = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1d0,1);
        std::ostream::_M_insert<double>((double)a_s->_begin[uVar4].score);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)a_s->_end - (long)a_s->_begin >> 3));
    }
    local_1d0 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1d0,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
      operator_delete((undefined1 *)CONCAT71(uStack_1cf,local_1d0));
    }
    std::__cxx11::stringbuf::str();
    uVar4 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1cf,local_1d0),local_1c8 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
      operator_delete((undefined1 *)CONCAT71(uStack_1cf,local_1d0));
    }
    if (uVar4 != local_1c8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar2 = __errno_location();
      __s = strerror(*piVar2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d1a10);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return;
}

Assistant:

void print_action_score(int f, v_array<action_score>& a_s, v_array<char>&)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < a_s.size(); i++)
    {
      if (i > 0)
        ss << ',';
      ss << a_s[i].action << ':' << a_s[i].score;
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}